

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O2

void __thiscall
HashtableAllTest_Clear_Test<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::~HashtableAllTest_Clear_Test
          (HashtableAllTest_Clear_Test<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::~HashtableTest((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    *)this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Clear) {
  for (int i = 1; i < 200; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  this->ht_.clear();
  EXPECT_EQ(0u, this->ht_.size());
  // TODO(csilvers): do we want to enforce that the hashtable has or
  // has not shrunk?  It does for dense_* but not sparse_*.
}